

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInteract.c
# Opt level: O0

void cuddSetInteract(DdManager *table,int x,int y)

{
  int iVar1;
  int iVar2;
  int bit;
  int word;
  int posn;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  iVar1 = (((table->size * 2 - x) + -3) * x >> 1) + y + -1;
  iVar2 = iVar1 >> 6;
  table->interact[iVar2] = 1L << ((byte)iVar1 & 0x3f) | table->interact[iVar2];
  return;
}

Assistant:

void
cuddSetInteract(
  DdManager * table,
  int  x,
  int  y)
{
    int posn, word, bit;

#ifdef DD_DEBUG
    assert(x < y);
    assert(y < table->size);
    assert(x >= 0);
#endif

    posn = ((((table->size << 1) - x - 3) * x) >> 1) + y - 1;
    word = posn >> LOGBPL;
    bit = posn & (BPL-1);
    table->interact[word] |= 1L << bit;

}